

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_qsub16_arm(uint32_t a,uint32_t b)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = ((a & 0xffff) >> 0xf) + 0x7fff;
  if (-1 < (short)(((ushort)(a - b) ^ (ushort)a) & ((ushort)b ^ (ushort)a))) {
    uVar3 = a - b;
  }
  iVar4 = (a >> 0x10) - (b >> 0x10);
  uVar1 = (ushort)(a >> 0x10);
  iVar2 = ((int)a < 0) + 0x7fff;
  if (-1 < (short)(((ushort)iVar4 ^ uVar1) & ((ushort)(b >> 0x10) ^ uVar1))) {
    iVar2 = iVar4;
  }
  return iVar2 << 0x10 | uVar3 & 0xffff;
}

Assistant:

uint32_t HELPER(glue(PFX,sub16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b, 0);
    SUB16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}